

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O2

FT_UInt32 ps_unicodes_char_next(PS_Unicodes table,FT_UInt32 *unicode)

{
  PS_UniMap *pPVar1;
  FT_UInt32 FVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar3 = *unicode + 1;
  uVar6 = 0;
  FVar2 = 0;
  uVar5 = table->num_maps;
  do {
    uVar4 = uVar5;
    if (uVar4 < uVar6 || uVar4 - uVar6 == 0) {
      if (FVar2 == 0) {
        uVar3 = 0;
        FVar2 = 0;
        if (uVar6 < table->num_maps) {
          FVar2 = table->maps[uVar6].glyph_index;
          uVar3 = table->maps[uVar6].unicode & 0x7fffffff;
        }
      }
LAB_002104f7:
      *unicode = uVar3;
      return FVar2;
    }
    uVar5 = (uVar4 - uVar6 >> 1) + uVar6;
    pPVar1 = table->maps;
    if (pPVar1[uVar5].unicode == uVar3) {
      FVar2 = pPVar1[uVar5].glyph_index;
      goto LAB_002104f7;
    }
    uVar7 = pPVar1[uVar5].unicode & 0x7fffffff;
    if (uVar7 == uVar3) {
      FVar2 = pPVar1[uVar5].glyph_index;
    }
    if (uVar7 < uVar3) {
      uVar6 = uVar5 + 1;
      uVar5 = uVar4;
    }
  } while( true );
}

Assistant:

static FT_UInt32
  ps_unicodes_char_next( PS_Unicodes  table,
                         FT_UInt32   *unicode )
  {
    FT_UInt    result    = 0;
    FT_UInt32  char_code = *unicode + 1;


    {
      FT_UInt     min = 0;
      FT_UInt     max = table->num_maps;
      FT_UInt     mid;
      PS_UniMap*  map;
      FT_UInt32   base_glyph;


      while ( min < max )
      {
        mid = min + ( ( max - min ) >> 1 );
        map = table->maps + mid;

        if ( map->unicode == char_code )
        {
          result = map->glyph_index;
          goto Exit;
        }

        base_glyph = BASE_GLYPH( map->unicode );

        if ( base_glyph == char_code )
          result = map->glyph_index;

        if ( base_glyph < char_code )
          min = mid + 1;
        else
          max = mid;
      }

      if ( result )
        goto Exit;               /* we have a variant glyph */

      /* we didn't find it; check whether we have a map just above it */
      char_code = 0;

      if ( min < table->num_maps )
      {
        map       = table->maps + min;
        result    = map->glyph_index;
        char_code = BASE_GLYPH( map->unicode );
      }
    }

  Exit:
    *unicode = char_code;
    return result;
  }